

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLABecLaplacian::averageDownCoeffsToCoarseAmrLevel(MLABecLaplacian *this,int flev)

{
  pointer pVVar1;
  pointer paVar2;
  MultiFab *pMVar3;
  pointer pVVar4;
  int iVar5;
  undefined1 *local_5c;
  int local_54;
  Array<MultiFab_*,_3> local_50;
  Array<const_MultiFab_*,_3> local_38;
  
  pVVar1 = (this->m_b_coeffs).
           super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
           .
           super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = *(pointer *)
            ((long)&pVVar1[flev].
                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            + 8);
  iVar5 = flev + -1;
  pMVar3 = *(MultiFab **)
            &pVVar1[iVar5].
             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
    pVVar4 = (this->m_a_coeffs).
             super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    average_down(*(pointer *)
                  ((long)&pVVar4[flev].
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> + 8)
                 + -1,*(MultiFab **)
                       &pVVar4[iVar5].
                        super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,0,1,2)
    ;
  }
  local_38._M_elems[0] = paVar2[-1]._M_elems;
  local_38._M_elems[1] = paVar2[-1]._M_elems + 1;
  local_38._M_elems[2] = paVar2[-1]._M_elems + 2;
  local_50._M_elems[1] = pMVar3 + 1;
  local_50._M_elems[2] = pMVar3 + 2;
  local_5c = &DAT_200000002;
  local_54 = 2;
  local_50._M_elems[0] = pMVar3;
  average_down_faces(&local_38,&local_50,(IntVect *)&local_5c,
                     *(Geometry **)
                      &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar5].
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  return;
}

Assistant:

void
MLABecLaplacian::averageDownCoeffsToCoarseAmrLevel (int flev)
{
    auto& fine_a_coeffs = m_a_coeffs[flev  ].back();
    auto& fine_b_coeffs = m_b_coeffs[flev  ].back();
    auto& crse_a_coeffs = m_a_coeffs[flev-1].front();
    auto& crse_b_coeffs = m_b_coeffs[flev-1].front();

    if (m_a_scalar != 0.0) {
        // We coarsen from the back of flev to the front of flev-1.
        // So we use mg_coarsen_ratio.
        amrex::average_down(fine_a_coeffs, crse_a_coeffs, 0, 1, mg_coarsen_ratio);
    }

    amrex::average_down_faces(amrex::GetArrOfConstPtrs(fine_b_coeffs),
                              amrex::GetArrOfPtrs(crse_b_coeffs),
                              IntVect(mg_coarsen_ratio), m_geom[flev-1][0]);
}